

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdi::ControllerWidget::mousePressEvent(ControllerWidget *this,QMouseEvent *event)

{
  undefined4 uVar1;
  uint uVar2;
  SubControl SVar3;
  QStyle *pQVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  ulong local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 1) {
    uVar1 = QEventPoint::position();
    auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar7 = minpd(_DAT_0066f5d0,auVar7);
    auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
    auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
    uVar2 = movmskpd(uVar1,auVar6);
    uVar5 = 0x8000000000000000;
    if ((uVar2 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
    }
    local_80 = 0x80000000;
    if ((uVar2 & 2) != 0) {
      local_80 = (ulong)(uint)(int)auVar7._8_8_;
    }
    local_80 = local_80 | uVar5;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionComplex::QStyleOptionComplex((QStyleOptionComplex *)&local_78,1,0xf0000);
    QStyleOption::initFrom((QStyleOption *)&local_78,&this->super_QWidget);
    local_38 = (undefined1 *)
               (ulong)(this->visibleControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                      super_QFlagsStorage<QStyle::SubControl>.i;
    pQVar4 = QWidget::style(&this->super_QWidget);
    SVar3 = (**(code **)(*(long *)pQVar4 + 0xd0))
                      (pQVar4,8,(QStyleOptionComplex *)&local_78,&local_80,this);
    QStyleOption::~QStyleOption((QStyleOption *)&local_78);
    this->activeControl = SVar3;
    QWidget::update(&this->super_QWidget);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mousePressEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }
    activeControl = getSubControl(event->position().toPoint());
    update();
}